

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall CLI::App::get_option(App *this,string *option_name)

{
  pointer pcVar1;
  Option *pOVar2;
  OptionNotFound *this_00;
  string local_68;
  string local_48;
  
  pcVar1 = (option_name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + option_name->_M_string_length);
  pOVar2 = get_option_no_throw(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (pOVar2 != (Option *)0x0) {
    return pOVar2;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (option_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + option_name->_M_string_length);
  CLI::OptionNotFound::OptionNotFound(this_00,&local_68);
  __cxa_throw(this_00,&CLI::OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_NODISCARD const Option *get_option(std::string option_name) const {
        const auto *opt = get_option_no_throw(option_name);
        if(opt == nullptr) {
            throw OptionNotFound(option_name);
        }
        return opt;
    }